

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::rust::UnderscoreDelimitFullName_abi_cxx11_
          (string *__return_storage_ptr__,rust *this,Context *ctx,string_view full_name)

{
  size_t sVar1;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  char *local_20;
  
  sVar1 = full_name._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar1,(long)&ctx->opts_ + sVar1,sVar1,full_name._M_str
            );
  local_38 = 1;
  local_30 = ".";
  local_28 = 1;
  local_20 = "_";
  absl::lts_20240722::StrReplaceAll(&local_38,1,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string UnderscoreDelimitFullName(Context& ctx,
                                      absl::string_view full_name) {
  std::string result = std::string(full_name);
  absl::StrReplaceAll({{".", "_"}}, &result);
  return result;
}